

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

char * event_mm_strdup_(char *str)

{
  bool bVar1;
  size_t sVar2;
  _func_void_ptr_size_t *__dest;
  int *piVar3;
  char *pcVar4;
  _func_void_ptr_size_t *p_Var5;
  
  p_Var5 = mm_malloc_fn_;
  if (str == (char *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    return (char *)0x0;
  }
  if (mm_malloc_fn_ == (_func_void_ptr_size_t *)0x0) {
    pcVar4 = strdup(str);
    return pcVar4;
  }
  sVar2 = strlen(str);
  if (sVar2 != 0xffffffffffffffff) {
    __dest = (_func_void_ptr_size_t *)(*p_Var5)(sVar2 + 1);
    if (__dest != (_func_void_ptr_size_t *)0x0) {
      memcpy(__dest,str,sVar2 + 1);
      bVar1 = true;
      p_Var5 = __dest;
      goto LAB_0024faa9;
    }
  }
  bVar1 = false;
LAB_0024faa9:
  if (!bVar1) {
    piVar3 = __errno_location();
    *piVar3 = 0xc;
    return (char *)0x0;
  }
  return (char *)p_Var5;
}

Assistant:

char *
event_mm_strdup_(const char *str)
{
	if (!str) {
		errno = EINVAL;
		return NULL;
	}

	if (mm_malloc_fn_) {
		size_t ln = strlen(str);
		void *p = NULL;
		if (ln == EV_SIZE_MAX)
			goto error;
		p = mm_malloc_fn_(ln+1);
		if (p)
			return memcpy(p, str, ln+1);
	} else
#ifdef _WIN32
		return _strdup(str);
#else
		return strdup(str);
#endif

error:
	errno = ENOMEM;
	return NULL;
}